

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_plm(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  opj_event_mgr_t *p_manager_local;
  OPJ_UINT32 p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xe55,
                  "OPJ_BOOL opj_j2k_read_plm(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xe56,
                  "OPJ_BOOL opj_j2k_read_plm(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xe57,
                  "OPJ_BOOL opj_j2k_read_plm(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_header_size == 0) {
    opj_event_msg(p_manager,1,"Error reading PLM marker\n");
  }
  p_j2k_local._4_4_ = (uint)(p_header_size != 0);
  return p_j2k_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_j2k_read_plm(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    OPJ_UNUSED(p_j2k);
    OPJ_UNUSED(p_header_data);

    if (p_header_size < 1) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading PLM marker\n");
        return OPJ_FALSE;
    }
    /* Do not care of this at the moment since only local variables are set here */
    /*
    opj_read_bytes(p_header_data,&l_Zplm,1);                                        // Zplm
    ++p_header_data;
    --p_header_size;

    while
            (p_header_size > 0)
    {
            opj_read_bytes(p_header_data,&l_Nplm,1);                                // Nplm
            ++p_header_data;
            p_header_size -= (1+l_Nplm);
            if
                    (p_header_size < 0)
            {
                    opj_event_msg(p_manager, EVT_ERROR, "Error reading PLM marker\n");
                    return false;
            }
            for
                    (i = 0; i < l_Nplm; ++i)
            {
                    opj_read_bytes(p_header_data,&l_tmp,1);                         // Iplm_ij
                    ++p_header_data;
                    // take only the last seven bytes
                    l_packet_len |= (l_tmp & 0x7f);
                    if
                            (l_tmp & 0x80)
                    {
                            l_packet_len <<= 7;
                    }
                    else
                    {
            // store packet length and proceed to next packet
                            l_packet_len = 0;
                    }
            }
            if
                    (l_packet_len != 0)
            {
                    opj_event_msg(p_manager, EVT_ERROR, "Error reading PLM marker\n");
                    return false;
            }
    }
    */
    return OPJ_TRUE;
}